

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

ScriptPubKeyMan * __thiscall
wallet::CWallet::GetScriptPubKeyMan(CWallet *this,OutputType *type,bool internal)

{
  long lVar1;
  const_iterator cVar2;
  ScriptPubKeyMan *pSVar3;
  undefined3 in_register_00000011;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_internal_spk_managers;
  if (CONCAT31(in_register_00000011,internal) == 0) {
    this_00 = &this->m_external_spk_managers;
  }
  cVar2 = std::
          _Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>,_std::_Select1st<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
          ::find(&this_00->_M_t,type);
  if ((_Rb_tree_header *)cVar2._M_node == &(this_00->_M_t)._M_impl.super__Rb_tree_header) {
    pSVar3 = (ScriptPubKeyMan *)0x0;
  }
  else {
    pSVar3 = (ScriptPubKeyMan *)cVar2._M_node[1]._M_parent;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pSVar3;
  }
  __stack_chk_fail();
}

Assistant:

ScriptPubKeyMan* CWallet::GetScriptPubKeyMan(const OutputType& type, bool internal) const
{
    const std::map<OutputType, ScriptPubKeyMan*>& spk_managers = internal ? m_internal_spk_managers : m_external_spk_managers;
    std::map<OutputType, ScriptPubKeyMan*>::const_iterator it = spk_managers.find(type);
    if (it == spk_managers.end()) {
        return nullptr;
    }
    return it->second;
}